

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O3

bool P_CheckPosition(AActor *thing,DVector2 *pos,FCheckPosition *tm,bool actorsonly)

{
  double *pdVar1;
  FDisplacement *pFVar2;
  DVector2 *pDVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  sector_t *psVar11;
  player_t *ppVar12;
  F3DFloor *pFVar13;
  secplane_t *psVar14;
  secplane_t *psVar15;
  DVector2 DVar16;
  DVector2 DVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  spechit_t *psVar21;
  undefined8 line;
  bool bVar22;
  int iVar23;
  subsector_t *psVar24;
  extsector_t *peVar25;
  undefined8 extraout_RAX;
  line_t *ld;
  byte bVar26;
  undefined7 in_register_00000009;
  byte bVar27;
  FBoundingBox *box;
  FMultiBlockThingsIterator *it_00;
  FBoundingBox *this;
  line_t *plVar28;
  ulong uVar29;
  undefined4 uVar30;
  double portalz;
  undefined4 uVar31;
  undefined4 uVar32;
  undefined4 uVar33;
  double dVar34;
  sector_t *psVar35;
  double dVar36;
  AActor *pAVar37;
  double dVar38;
  double zofs;
  CheckResult lcres;
  FPortalGroupArray pcheck;
  DVector2 ref_1;
  DVector2 ref;
  FMultiBlockLinesIterator it;
  CheckResult tcres;
  FMultiBlockThingsIterator it2;
  double local_480;
  line_t *local_478;
  sector_t *psStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  AActor *local_458;
  double dStack_450;
  undefined1 local_448 [16];
  sector_t *psStack_438;
  double local_430;
  uint local_428;
  FName local_41c;
  double local_418;
  double dStack_410;
  double local_408;
  undefined8 uStack_400;
  FBoundingBox local_3f0;
  line_t *local_3d0;
  DVector2 local_3c8;
  double local_3b8;
  uint local_3b0;
  FLineOpening local_3a8;
  double local_318;
  double dStack_310;
  FPortalGroupArray local_300;
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [176];
  FBoundingBox local_218;
  CheckResult local_1f8;
  FMultiBlockThingsIterator local_1d0;
  
  local_418 = (double)CONCAT44(local_418._4_4_,(int)CONCAT71(in_register_00000009,actorsonly));
  local_478 = (line_t *)thing->Height;
  tm->thing = thing;
  dVar36 = pos->X;
  dVar18 = pos->Y;
  (tm->pos).X = dVar36;
  (tm->pos).Y = dVar18;
  (tm->pos).Z = (thing->__Pos).Z;
  psVar24 = P_PointInSubsector(dVar36,dVar18);
  psVar11 = psVar24->sector;
  tm->sector = psVar11;
  thing->BlockingLine = (line_t *)0x0;
  tm->ceilingline = (line_t *)0x0;
  ppVar12 = thing->player;
  if (((ppVar12 == (player_t *)0x0) || (ppVar12->mo != (APlayerPawn *)thing)) ||
     ((ppVar12->cheats & 0x40000000) == 0)) {
    if (((psVar11->planes[1].Flags & 0x1d0U) == 0x100) ||
       ((psVar11->planes[0].Flags & 0x1d0U) == 0x100)) {
      P_GetFloorCeilingZ(tm,2);
    }
    else {
      dVar19 = pos->X;
      dVar20 = pos->Y;
      dVar36 = (psVar11->floorplane).normal.X;
      dVar18 = (psVar11->floorplane).D;
      dVar4 = (psVar11->floorplane).normal.Y;
      dVar38 = (psVar11->floorplane).negiC;
      (tm->floorpic).texnum = psVar11->planes[0].Texture.texnum;
      dVar34 = (psVar11->ceilingplane).normal.X;
      dVar5 = (psVar11->ceilingplane).D;
      dVar6 = (psVar11->ceilingplane).normal.Y;
      dVar7 = (psVar11->ceilingplane).negiC;
      dVar38 = dVar38 * (dVar4 * dVar20 + dVar18 + dVar36 * dVar19);
      tm->dropoffz = dVar38;
      tm->floorz = dVar38;
      tm->ceilingz = dVar7 * (dVar6 * dVar20 + dVar5 + dVar34 * dVar19);
      (tm->ceilingpic).texnum = psVar11->planes[1].Texture.texnum;
      tm->ceilingsector = psVar11;
      tm->floorsector = psVar11;
      iVar23 = sector_t::GetTerrain(psVar11,0);
      tm->floorterrain = iVar23;
    }
    peVar25 = psVar11->e;
    if ((peVar25->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count != 0) {
      uVar29 = -(ulong)(0.0 < thing->Height);
      psVar35 = (sector_t *)
                ((double)(~uVar29 & 0x3ff0000000000000 | (ulong)thing->Height & uVar29) +
                (thing->__Pos).Z);
      dVar36 = 0.0;
      uVar29 = 0;
      uStack_460 = 0.0;
      local_468 = psVar35;
      do {
        pFVar13 = (peVar25->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array[uVar29];
        if ((~pFVar13->flags & 3) == 0) {
          psVar14 = (pFVar13->bottom).plane;
          dVar4 = pos->Y;
          psVar15 = (pFVar13->top).plane;
          pAVar37 = (AActor *)
                    ((dVar4 * (psVar14->normal).Y + (psVar14->normal).X * pos->X + psVar14->D) *
                    psVar14->negiC);
          dVar18 = ((psVar15->normal).Y * dVar4 + psVar15->D + (psVar15->normal).X * pos->X) *
                   psVar15->negiC;
          dVar34 = (dVar18 - (double)pAVar37) * 0.5 + (double)pAVar37;
          dVar38 = (thing->__Pos).Z - dVar34;
          dVar34 = (double)psVar35 - dVar34;
          if ((tm->floorz <= dVar18 && dVar18 != tm->floorz) && (ABS(dVar38) < ABS(dVar34))) {
            tm->dropoffz = dVar18;
            tm->floorz = dVar18;
            (tm->floorpic).texnum = ((pFVar13->top).texture)->texnum;
            uStack_400 = 0;
            local_458 = pAVar37;
            dStack_450 = dVar4;
            local_408 = dVar38;
            local_318 = dVar34;
            dStack_310 = dVar36;
            iVar23 = sector_t::GetTerrain(pFVar13->model,(pFVar13->top).isceiling);
            tm->floorterrain = iVar23;
            pAVar37 = local_458;
            dVar38 = local_408;
            dVar34 = local_318;
            psVar35 = local_468;
            dVar36 = uStack_460;
          }
          if (((double)pAVar37 < tm->ceilingz) && (ABS(dVar34) <= ABS(dVar38))) {
            tm->ceilingz = (double)pAVar37;
            (tm->ceilingpic).texnum = ((pFVar13->bottom).texture)->texnum;
          }
        }
        uVar29 = uVar29 + 1;
        peVar25 = psVar11->e;
      } while (uVar29 < (peVar25->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count);
    }
  }
  else {
    dVar36 = sector_t::LowestFloorAt(psVar11,pos,&tm->floorsector);
    tm->dropoffz = dVar36;
    tm->floorz = dVar36;
    dVar36 = sector_t::HighestCeilingAt(psVar11,pos,&tm->ceilingsector);
    tm->ceilingz = dVar36;
    psVar35 = tm->floorsector;
    (tm->floorpic).texnum = psVar35->planes[0].Texture.texnum;
    iVar23 = sector_t::GetTerrain(psVar35,0);
    tm->floorterrain = iVar23;
    (tm->ceilingpic).texnum = tm->ceilingsector->planes[1].Texture.texnum;
  }
  tm->touchmidtex = false;
  tm->abovemidtex = false;
  validcount = validcount + 1;
  if (((thing->flags).Value & 0x1001000) == 0x1000) {
    return true;
  }
  thing->BlockingMobj = (AActor *)0x0;
  if (thing->player == (player_t *)0x0) {
    dVar36 = thing->Height;
  }
  else {
    dVar36 = thing->MaxStepHeight + (double)local_478;
    thing->Height = dVar36;
  }
  tm->stepthing = (AActor *)0x0;
  local_300.data.Array = (unsigned_short *)0x0;
  local_300.data.Most = 0;
  local_300.data.Count = 0;
  local_300.method = 1;
  local_300.varused = '\0';
  local_300.inited = false;
  FMultiBlockThingsIterator::FMultiBlockThingsIterator
            (&local_1d0,&local_300,pos->X,pos->Y,(thing->__Pos).Z,dVar36,thing->radius,false,psVar11
            );
  local_458 = (AActor *)0x0;
  while (it_00 = &local_1d0, bVar22 = FMultiBlockThingsIterator::Next(&local_1d0,&local_1f8), bVar22
        ) {
    bVar22 = PIT_CheckThing(it_00,&local_1f8,box,tm);
    if (!bVar22) {
      pAVar37 = thing->BlockingMobj;
      if (((pAVar37 == (AActor *)0x0) || (((byte)i_compatflags & 0x10) != 0)) ||
         (((byte)local_1f8.portalflags & 0x80) != 0)) {
LAB_0053b9de:
        thing->Height = (double)local_478;
        goto LAB_0053b9ec;
      }
      if (((pAVar37->player != (player_t *)0x0) || (((thing->flags).Value & 0x1014000) != 0)) ||
         (dVar36 = (pAVar37->__Pos).Z,
         thing->MaxStepHeight < (pAVar37->Height + dVar36) - (thing->__Pos).Z)) {
        if (((thing->player == (player_t *)0x0) ||
            (thing->MaxStepHeight < ((thing->__Pos).Z + thing->Height) - (pAVar37->__Pos).Z)) ||
           (local_458 != (AActor *)0x0)) goto LAB_0053b9de;
        local_458 = (AActor *)0x0;
      }
      else if ((local_458 == (AActor *)0x0) ||
              (pdVar1 = &(local_458->__Pos).Z, *pdVar1 <= dVar36 && dVar36 != *pdVar1)) {
        local_458 = pAVar37;
      }
      thing->BlockingMobj = (AActor *)0x0;
    }
  }
  validcount = validcount + 1;
  thing->BlockingMobj = (AActor *)0x0;
  thing->Height = (double)local_478;
  if ((local_418._0_1_ != '\0') || (((thing->flags).Value & 0x1000) != 0)) {
    thing->BlockingMobj = local_458;
    bVar22 = local_458 == (AActor *)0x0;
    goto LAB_0053b9f6;
  }
  if (spechit.Count != 0) {
    spechit.Count = 0;
  }
  if (portalhit.Count != 0) {
    portalhit.Count = 0;
  }
  FMultiBlockLinesIterator::FMultiBlockLinesIterator
            ((FMultiBlockLinesIterator *)(local_2c8 + 0x38),&local_300,pos->X,pos->Y,
             (thing->__Pos).Z,(double)local_478,thing->radius,psVar11);
  local_318 = tm->floorz;
  tm->floorz = tm->dropoffz;
  local_408 = (double)CONCAT44(local_408._4_4_,(int)CONCAT71((int7)((ulong)extraout_RAX >> 8),1));
  while (bVar22 = FMultiBlockLinesIterator::Next
                            ((FMultiBlockLinesIterator *)(local_2c8 + 0x38),(CheckResult *)local_448
                            ), line = local_448._0_8_, bVar22) {
    if ((((((double *)(local_448._0_8_ + 0x58))[3] <= local_218.m_Box[2]) ||
         (local_218.m_Box[3] < ((double *)(local_448._0_8_ + 0x58))[2] ||
          local_218.m_Box[3] == ((double *)(local_448._0_8_ + 0x58))[2])) ||
        (local_218.m_Box[0] < ((double *)(local_448._0_8_ + 0x58))[1] ||
         local_218.m_Box[0] == ((double *)(local_448._0_8_ + 0x58))[1])) ||
       (*(double *)(local_448._0_8_ + 0x58) <= local_218.m_Box[1])) {
LAB_0053ad34:
      uVar8 = *(uint *)(local_448._0_8_ + 0x90);
      if (((linePortals.Array != (FLinePortal *)0x0 && uVar8 < linePortals.Count) &&
          ((linePortals.Array[uVar8].mFlags & 2) != 0)) &&
         (linePortals.Array[uVar8].mType != '\x03')) {
        local_3d0 = (line_t *)local_448._0_8_;
        local_3c8.X = (double)local_448._8_8_;
        local_3c8.Y = (double)psStack_438;
        local_3b8 = local_430;
        local_3b0 = local_428;
        if (((((local_428 & 0x60) == 0) &&
             (local_218.m_Box[2] < ((double *)(local_448._0_8_ + 0x58))[3])) &&
            ((((double *)(local_448._0_8_ + 0x58))[2] <= local_218.m_Box[3] &&
              local_218.m_Box[3] != ((double *)(local_448._0_8_ + 0x58))[2] &&
             ((((double *)(local_448._0_8_ + 0x58))[1] <= local_218.m_Box[0] &&
               local_218.m_Box[0] != ((double *)(local_448._0_8_ + 0x58))[1] &&
              (local_218.m_Box[1] < *(double *)(local_448._0_8_ + 0x58))))))) &&
           (iVar23 = FBoundingBox::BoxOnLineSide(&local_218,(line_t *)local_448._0_8_), iVar23 == -1
           )) {
          if (local_3d0->portalindex < linePortals.Count) {
            plVar28 = linePortals.Array[local_3d0->portalindex].mDestination;
          }
          else {
            plVar28 = (line_t *)0x0;
          }
          local_480 = 0.0;
          P_TranslatePortalXY(local_3d0,&local_3c8.X,&local_3c8.Y);
          P_TranslatePortalZ(local_3d0,&local_480);
          local_468 = plVar28->backsector;
          if (local_468 == (sector_t *)0x0) {
            plVar28->backsector = plVar28->frontsector;
          }
          pAVar37 = tm->thing;
          (pAVar37->__Pos).Z = local_480 + (pAVar37->__Pos).Z;
          local_3f0.m_Box[2] = pAVar37->radius;
          local_3f0.m_Box[0] = local_3c8.Y + local_3f0.m_Box[2];
          local_3f0.m_Box[3] = local_3c8.X + local_3f0.m_Box[2];
          local_3f0.m_Box[1] = local_3c8.Y - local_3f0.m_Box[2];
          local_3f0.m_Box[2] = local_3c8.X - local_3f0.m_Box[2];
          FBlockLinesIterator::FBlockLinesIterator((FBlockLinesIterator *)local_2c8,&local_3f0);
          ld = FBlockLinesIterator::Next((FBlockLinesIterator *)local_2c8);
          if (ld == (line_t *)0x0) {
            (tm->thing->__Pos).Z = (tm->thing->__Pos).Z - local_480;
            plVar28->backsector = local_468;
          }
          else {
            local_478 = (line_t *)((ulong)local_478 & 0xffffffff00000000);
            do {
              if (((((ld->bbox[3] <= local_3f0.m_Box[2]) ||
                    (local_3f0.m_Box[3] < ld->bbox[2] || local_3f0.m_Box[3] == ld->bbox[2])) ||
                   (local_3f0.m_Box[0] < ld->bbox[1] || local_3f0.m_Box[0] == ld->bbox[1])) ||
                  ((ld->bbox[0] <= local_3f0.m_Box[1] ||
                   (iVar23 = FBoundingBox::BoxOnLineSide(&local_3f0,ld), iVar23 != -1)))) ||
                 (ld->backsector == (sector_t *)0x0)) {
                ld = FBlockLinesIterator::Next((FBlockLinesIterator *)local_2c8);
              }
              else {
                FindRefPoint((line_t *)local_2d8,(DVector2 *)ld);
                P_LineOpening(&local_3a8,tm->thing,ld,(DVector2 *)local_2d8,&local_3c8,0);
                if (local_3a8.top - local_480 < tm->ceilingz) {
                  tm->ceilingz = local_3a8.top - local_480;
                  (tm->ceilingpic).texnum = local_3a8.ceilingpic.texnum;
                  local_478 = (line_t *)
                              CONCAT44(local_478._4_4_,
                                       (int)CONCAT71((uint7)(uint3)((uint)local_3a8.ceilingpic.
                                                                          texnum >> 8),1));
                }
                dVar36 = local_3a8.bottom - local_480;
                if (tm->floorz <= dVar36 && dVar36 != tm->floorz) {
                  tm->floorz = dVar36;
                  (tm->floorpic).texnum = local_3a8.floorpic.texnum;
                  tm->floorterrain = local_3a8.floorterrain;
                  local_478 = (line_t *)
                              CONCAT44(local_478._4_4_,
                                       (int)CONCAT71((uint7)(uint3)((uint)local_3a8.floorterrain >>
                                                                   8),1));
                }
                if (local_3a8.lowfloor - local_480 < tm->dropoffz) {
                  tm->dropoffz = local_3a8.lowfloor - local_480;
                }
                ld = FBlockLinesIterator::Next((FBlockLinesIterator *)local_2c8);
              }
            } while (ld != (line_t *)0x0);
            pAVar37 = tm->thing;
            (pAVar37->__Pos).Z = (pAVar37->__Pos).Z - local_480;
            plVar28->backsector = local_468;
            if (((ulong)local_478 & 1) != 0) {
              pAVar37->BlockingLine = (line_t *)local_448._0_8_;
            }
          }
        }
      }
    }
    else {
      this = &local_218;
      iVar23 = FBoundingBox::BoxOnLineSide(this,(line_t *)local_448._0_8_);
      if (iVar23 != -1) goto LAB_0053ad34;
      if (*(sector_t **)(line + 0x80) == (sector_t *)0x0) {
        if (((*(uint *)(local_448._0_8_ + 0x90) < linePortals.Count) &&
            ((linePortals.Array[*(uint *)(local_448._0_8_ + 0x90)].mFlags & 2) != 0)) &&
           (((*(side_t **)(local_448._0_8_ + 0x48))->Flags & 0x40) != 0)) {
          local_3a8.top = (double)line;
          local_3a8.lowfloor = (double)local_448._8_8_;
          local_3a8.bottomsec = psStack_438;
          AActor::PosRelative((DVector3 *)local_2c8,tm->thing,(line_t *)line);
          local_3a8.bottom = (double)local_2c8._0_8_;
          local_3a8.range = (double)local_2c8._8_8_;
          TArray<spechit_t,_spechit_t>::Push(&portalhit,(spechit_t *)&local_3a8);
        }
        else {
          psVar11 = *(sector_t **)(local_448._0_8_ + 0x78);
          if (((local_428 & 0x20) == 0) ||
             (((psVar11->planes[0].Flags & 0x1d0U) == 0x100 &&
              (sectorPortals.Array[psVar11->Portals[0]].mPlaneZ <
               (tm->thing->__Pos).Z + tm->thing->Height)))) {
            uVar8 = psVar11->planes[1].Flags;
            if ((local_428 & 0x40) == 0) {
              pAVar37 = tm->thing;
              if ((uVar8 & 0x1d0) == 0x100) goto LAB_0053b172;
LAB_0053b1d7:
              if (((pAVar37->flags2).Value & 8) != 0) {
                local_480 = (double)CONCAT44(local_480._4_4_,0x84);
                local_3f0.m_Box[0] = 0.0;
                P_DamageMobj(pAVar37,(AActor *)0x0,(AActor *)0x0,pAVar37->Mass >> 5,
                             (FName *)&local_480,0,(DAngle *)&local_3f0);
                pAVar37 = tm->thing;
              }
              pAVar37->BlockingLine = (line_t *)line;
              CheckForPushSpecial((line_t *)line,0,pAVar37,(DVector2 *)0x0);
              goto LAB_0053b233;
            }
            if (((uVar8 & 0x1d0) == 0x100) &&
               (pAVar37 = tm->thing,
               (pAVar37->__Pos).Z < sectorPortals.Array[psVar11->Portals[1]].mPlaneZ)) {
LAB_0053b172:
              dVar36 = sectorPortals.Array[psVar11->Portals[1]].mPlaneZ;
              dVar18 = (pAVar37->__Pos).Z;
              if ((dVar36 <= dVar18) ||
                 ((dVar18 + pAVar37->MaxStepHeight < dVar36 ||
                  (dVar36 < tm->floorz || dVar36 == tm->floorz)))) goto LAB_0053b1d7;
              tm->floorz = dVar36;
              tm->floorsector = psVar11;
              (tm->floorpic).texnum =
                   (*(side_t **)(local_448._0_8_ + 0x48))->textures[1].texture.texnum;
              tm->floorterrain = 0;
              tm->portalstep = true;
            }
          }
        }
        goto LAB_0053ad34;
      }
      pAVar37 = tm->thing;
      uVar8 = (pAVar37->flags).Value;
      bVar27 = 1;
      bVar26 = 1;
      if ((uVar8 >> 0x10 & 1) == 0) {
        bVar26 = (*(byte *)((long)&(pAVar37->BounceFlags).Value + 1) & 0x10) >> 4;
      }
      if (((pAVar37->flags3).Value & 0x100000) == 0) {
        if ((i_compatflags._3_1_ & 4) == 0) {
          bVar27 = 0;
        }
        else {
          bVar27 = (byte)(uVar8 >> 0x1b) & 1;
        }
      }
      uVar9 = *(DWORD *)(line + 0x20);
      if ((bVar26 & (uVar9 & 0x1008000) == 0) == 0) {
        uVar30 = (undefined4)CONCAT71((int7)((ulong)this >> 8),1);
        if (((uVar9 >> 0x11 & 1) == 0) &&
           (((((uVar9 & 0x8001) != 0 || ((byte)(~bVar27 & (byte)((uVar9 & 2) >> 1)) != 0)) ||
             ((((uVar9 >> 0xe & 1) != 0 && (pAVar37->player != (player_t *)0x0)) ||
              ((bVar26 & (byte)(uVar9 >> 0x18) & 1) != 0)))) ||
            ((uVar30 = 0, (uVar8 >> 0xe & 1) != 0 && ((uVar9 & 0x40000) != 0)))))) {
          if ((local_428 & 0x20) == 0) {
            if ((local_428 & 0x40) == 0) {
              if (((pAVar37->flags2).Value & 8) != 0) {
                local_41c.Index = 0x84;
                local_2d8._0_8_ = 0.0;
                P_DamageMobj(pAVar37,(AActor *)0x0,(AActor *)0x0,pAVar37->Mass >> 5,&local_41c,0,
                             (DAngle *)local_2d8);
                pAVar37 = tm->thing;
              }
              pAVar37->BlockingLine = (line_t *)line;
              local_3a8.top = (double)local_448._8_8_;
              local_3a8.bottom = (double)psStack_438;
              iVar23 = P_PointOnLineSide((DVector2 *)&local_3a8,(line_t *)line);
              CheckForPushSpecial((line_t *)line,iVar23,tm->thing,(DVector2 *)0x0);
              goto LAB_0053b233;
            }
            psVar11 = *(sector_t **)(local_448._0_8_ + 0x78);
            if ((psVar11->planes[1].Flags & 0x1d0U) == 0x100) {
              dVar36 = sectorPortals.Array[psVar11->Portals[1]].mPlaneZ;
              if ((pAVar37->__Pos).Z < dVar36) goto LAB_0053af5c;
              if (tm->floorz <= dVar36 && dVar36 != tm->floorz) {
                tm->floorz = dVar36;
                tm->floorsector = psVar11;
                tm->floorterrain = 0;
              }
            }
          }
          else {
            psVar11 = *(sector_t **)(local_448._0_8_ + 0x78);
            if ((psVar11->planes[0].Flags & 0x1d0U) == 0x100) {
              dVar36 = sectorPortals.Array[psVar11->Portals[0]].mPlaneZ;
              if (dVar36 < (pAVar37->__Pos).Z + pAVar37->Height) goto LAB_0053af5c;
              if (dVar36 < tm->ceilingz) {
                tm->ceilingz = dVar36;
                tm->ceilingsector = psVar11;
              }
            }
          }
          goto LAB_0053ad34;
        }
      }
      else {
LAB_0053af5c:
        uVar30 = 0;
      }
      local_468 = (sector_t *)CONCAT44(local_468._4_4_,uVar30);
      FindRefPoint((line_t *)local_2c8,(DVector2 *)line);
      P_LineOpening(&local_3a8,pAVar37,(line_t *)line,(DVector2 *)local_2c8,
                    (DVector2 *)(local_448 + 8),local_428);
      pAVar37 = tm->thing;
      if ((((pAVar37->flags).Value & 0x1600) != 0) ||
         (local_3a8.frontfloorplane.normal.Z < 0.707122802734375 !=
          0.707122802734375 <= local_3a8.backfloorplane.normal.Z)) {
        if ((local_3a8.frontfloorplane.normal.X != local_3a8.backfloorplane.normal.X) ||
           (NAN(local_3a8.frontfloorplane.normal.X) || NAN(local_3a8.backfloorplane.normal.X))) {
          bVar22 = false;
        }
        else if ((local_3a8.frontfloorplane.normal.Y != local_3a8.backfloorplane.normal.Y) ||
                (NAN(local_3a8.frontfloorplane.normal.Y) || NAN(local_3a8.backfloorplane.normal.Y)))
        {
          bVar22 = false;
        }
        else {
          bVar22 = local_3a8.backfloorplane.normal.Z == local_3a8.frontfloorplane.normal.Z;
        }
        if (bVar22) {
          if (((local_3a8.frontfloorplane.D == local_3a8.backfloorplane.D) &&
              (!NAN(local_3a8.frontfloorplane.D) && !NAN(local_3a8.backfloorplane.D))) &&
             (-3.4028234663852886e+38 < local_3a8.bottom)) {
            local_3a8.bottom =
                 (local_3a8.frontfloorplane.normal.Y * (double)psStack_438 +
                 local_3a8.frontfloorplane.D +
                 local_3a8.frontfloorplane.normal.X * (double)local_448._8_8_) *
                 local_3a8.frontfloorplane.negiC;
          }
        }
        if ((char)local_468 != '\0') {
          if ((level.flags2._2_1_ & 0x20) != 0) {
            psVar11 = pAVar37->Sector;
            dVar36 = ((psVar11->floorplane).normal.Y * (double)local_2c8._8_8_ +
                     (psVar11->floorplane).D +
                     (psVar11->floorplane).normal.X * (double)local_2c8._0_8_) *
                     (psVar11->floorplane).negiC;
            if ((local_3a8.bottom != dVar36) || (NAN(local_3a8.bottom) || NAN(dVar36)))
            goto LAB_0053b305;
          }
          local_3a8.bottom = local_3a8.bottom + 32.0;
        }
LAB_0053b305:
        if (((local_428 & 0x40) == 0) && (local_3a8.top < tm->ceilingz)) {
          tm->ceilingz = local_3a8.top;
          tm->ceilingsector = local_3a8.topsec;
          (tm->ceilingpic).texnum = local_3a8.ceilingpic.texnum;
          tm->ceilingline = (line_t *)line;
          pAVar37->BlockingLine = (line_t *)line;
        }
        if ((local_428 & 0x20) == 0) {
          pdVar1 = &tm->floorz;
          if (local_3a8.bottom < *pdVar1 || local_3a8.bottom == *pdVar1) {
            if ((local_3a8.bottom == *pdVar1) && (!NAN(local_3a8.bottom) && !NAN(*pdVar1))) {
              tm->touchmidtex = (bool)(tm->touchmidtex | local_3a8.touchmidtex);
              tm->abovemidtex = (bool)(tm->abovemidtex | local_3a8.abovemidtex);
            }
          }
          else {
            tm->floorz = local_3a8.bottom;
            tm->floorsector = local_3a8.bottomsec;
            (tm->floorpic).texnum = local_3a8.floorpic.texnum;
            tm->floorterrain = local_3a8.floorterrain;
            tm->touchmidtex = local_3a8.touchmidtex;
            tm->abovemidtex = local_3a8.abovemidtex;
            pAVar37->BlockingLine = (line_t *)line;
          }
          if (local_3a8.lowfloor < tm->dropoffz) {
            tm->dropoffz = local_3a8.lowfloor;
          }
        }
        if (*(int *)(line + 0x28) != 0) {
          iVar23 = pAVar37->Sector->PortalGroup;
          iVar10 = (*(sector_t **)(line + 0x78))->PortalGroup;
          uVar30 = 0;
          uVar31 = 0;
          uVar32 = 0;
          uVar33 = 0;
          if (iVar23 != iVar10) {
            pFVar2 = Displacements.data.Array + (iVar10 * Displacements.size + iVar23);
            uVar30 = *(undefined4 *)&(pFVar2->pos).X;
            uVar31 = *(undefined4 *)((long)&(pFVar2->pos).X + 4);
            uVar32 = *(undefined4 *)&(pFVar2->pos).Y;
            uVar33 = *(undefined4 *)((long)&(pFVar2->pos).Y + 4);
          }
          local_468 = (sector_t *)CONCAT44(uVar31,uVar30);
          uStack_460 = (double)CONCAT44(uVar33,uVar32);
          local_478 = (line_t *)local_448._8_8_;
          psStack_470 = psStack_438;
          local_418 = (pAVar37->__Pos).X;
          dStack_410 = (pAVar37->__Pos).Y;
          TArray<spechit_t,_spechit_t>::Grow(&spechit,1);
          psVar21 = spechit.Array;
          uVar29 = (ulong)spechit.Count;
          spechit.Array[uVar29].line = (line_t *)line;
          DVar16.Y._0_4_ = SUB84(dStack_410 + uStack_460,0);
          DVar16.X = local_418 + (double)local_468;
          DVar16.Y._4_4_ = (int)((ulong)(dStack_410 + uStack_460) >> 0x20);
          psVar21[uVar29].Oldrefpos = DVar16;
          pDVar3 = &psVar21[uVar29].Refpos;
          pDVar3->X = (double)local_478;
          pDVar3->Y = (double)psStack_470;
          spechit.Count = spechit.Count + 1;
        }
        if ((*(uint *)(line + 0x90) < linePortals.Count) &&
           ((linePortals.Array[*(uint *)(line + 0x90)].mFlags & 2) != 0)) {
          pAVar37 = tm->thing;
          iVar23 = pAVar37->Sector->PortalGroup;
          iVar10 = (*(sector_t **)(line + 0x78))->PortalGroup;
          uVar30 = 0;
          uVar31 = 0;
          uVar32 = 0;
          uVar33 = 0;
          if (iVar23 != iVar10) {
            pFVar2 = Displacements.data.Array + (iVar10 * Displacements.size + iVar23);
            uVar30 = *(undefined4 *)&(pFVar2->pos).X;
            uVar31 = *(undefined4 *)((long)&(pFVar2->pos).X + 4);
            uVar32 = *(undefined4 *)&(pFVar2->pos).Y;
            uVar33 = *(undefined4 *)((long)&(pFVar2->pos).Y + 4);
          }
          local_468 = (sector_t *)CONCAT44(uVar31,uVar30);
          uStack_460 = (double)CONCAT44(uVar33,uVar32);
          local_478 = (line_t *)local_448._8_8_;
          psStack_470 = psStack_438;
          local_418 = (pAVar37->__Pos).X;
          dStack_410 = (pAVar37->__Pos).Y;
          TArray<spechit_t,_spechit_t>::Grow(&portalhit,1);
          psVar21 = portalhit.Array;
          uVar29 = (ulong)portalhit.Count;
          portalhit.Array[uVar29].line = (line_t *)line;
          DVar17.Y._0_4_ = SUB84(dStack_410 + uStack_460,0);
          DVar17.X = local_418 + (double)local_468;
          DVar17.Y._4_4_ = (int)((ulong)(dStack_410 + uStack_460) >> 0x20);
          psVar21[uVar29].Oldrefpos = DVar17;
          pDVar3 = &psVar21[uVar29].Refpos;
          pDVar3->X = (double)local_478;
          pDVar3->Y = (double)psStack_470;
          portalhit.Count = portalhit.Count + 1;
        }
        goto LAB_0053ad34;
      }
LAB_0053b233:
      local_408 = (double)((ulong)local_408 & 0xffffffff00000000);
    }
  }
  if (((ulong)local_408 & 1) == 0) {
LAB_0053b9ec:
    bVar22 = false;
    goto LAB_0053b9f6;
  }
  dVar36 = tm->floorz;
  uVar30 = SUB84(dVar36,0);
  uVar31 = (undefined4)((ulong)dVar36 >> 0x20);
  if (tm->ceilingz - dVar36 < thing->Height) {
    bVar22 = false;
    goto LAB_0053b9f6;
  }
  if (tm->touchmidtex == false) {
    uVar30 = SUB84(local_318,0);
    uVar31 = (undefined4)((ulong)local_318 >> 0x20);
    if (tm->stepthing != (AActor *)0x0) goto LAB_0053ba36;
  }
  else {
LAB_0053ba36:
    tm->dropoffz = (double)CONCAT44(uVar31,uVar30);
  }
  thing->BlockingMobj = local_458;
  bVar22 = local_458 == (AActor *)0x0;
LAB_0053b9f6:
  TArray<FBlockThingsIterator::HashEntry,_FBlockThingsIterator::HashEntry>::~TArray
            (&local_1d0.blockIterator.DynHash);
  TArray<unsigned_short,_unsigned_short>::~TArray(&local_300.data);
  return bVar22;
}

Assistant:

bool P_CheckPosition(AActor *thing, const DVector2 &pos, FCheckPosition &tm, bool actorsonly)
{
	sector_t *newsec;
	AActor *thingblocker;
	double realHeight = thing->Height;

	tm.thing = thing;

	tm.pos.X = pos.X;
	tm.pos.Y = pos.Y;
	tm.pos.Z = thing->Z();

	newsec = tm.sector = P_PointInSector(pos);
	tm.ceilingline = thing->BlockingLine = NULL;

	// Retrieve the base floor / ceiling from the target location.
	// Any contacted lines the step closer together will adjust them.
	if (!thing->IsNoClip2())
	{
		if (!newsec->PortalBlocksMovement(sector_t::ceiling) || !newsec->PortalBlocksMovement(sector_t::floor))
		{
			// Use P_GetFloorCeilingZ only if there's portals to consider. Its logic is subtly different than what is needed here for 3D floors.
			P_GetFloorCeilingZ(tm, FFCF_SAMESECTOR);
		}
		else
		{
			tm.floorz = tm.dropoffz = newsec->floorplane.ZatPoint(pos);
			tm.floorpic = newsec->GetTexture(sector_t::floor);
			tm.ceilingz = newsec->ceilingplane.ZatPoint(pos);
			tm.ceilingpic = newsec->GetTexture(sector_t::ceiling);
			tm.floorsector = tm.ceilingsector = newsec;
			tm.floorterrain = newsec->GetTerrain(sector_t::floor);
		}

		F3DFloor*  rover;
		double thingtop = thing->Height > 0 ? thing->Top() : thing->Z() + 1;

		for (unsigned i = 0; i<newsec->e->XFloor.ffloors.Size(); i++)
		{
			rover = newsec->e->XFloor.ffloors[i];
			if (!(rover->flags & FF_SOLID) || !(rover->flags & FF_EXISTS)) continue;

			double ff_bottom = rover->bottom.plane->ZatPoint(pos);
			double ff_top = rover->top.plane->ZatPoint(pos);

			double delta1 = thing->Z() - (ff_bottom + ((ff_top - ff_bottom) / 2));
			double delta2 = thingtop - (ff_bottom + ((ff_top - ff_bottom) / 2));

			if (ff_top > tm.floorz && fabs(delta1) < fabs(delta2))
			{
				tm.floorz = tm.dropoffz = ff_top;
				tm.floorpic = *rover->top.texture;
				tm.floorterrain = rover->model->GetTerrain(rover->top.isceiling);
			}
			if (ff_bottom < tm.ceilingz && fabs(delta1) >= fabs(delta2))
			{
				tm.ceilingz = ff_bottom;
				tm.ceilingpic = *rover->bottom.texture;
			}
		}
	}
	else
	{
		// With noclip2, we must ignore 3D floors and go right to the uppermost ceiling and lowermost floor.
		tm.floorz = tm.dropoffz = newsec->LowestFloorAt(pos, &tm.floorsector);
		tm.ceilingz = newsec->HighestCeilingAt(pos, &tm.ceilingsector);
		tm.floorpic = tm.floorsector->GetTexture(sector_t::floor);
		tm.floorterrain = tm.floorsector->GetTerrain(sector_t::floor);
		tm.ceilingpic = tm.ceilingsector->GetTexture(sector_t::ceiling);
	}

	tm.touchmidtex = false;
	tm.abovemidtex = false;
	validcount++;

	if ((thing->flags & MF_NOCLIP) && !(thing->flags & MF_SKULLFLY))
		return true;

	// Check things first, possibly picking things up.
	thing->BlockingMobj = NULL;
	thingblocker = NULL;
	if (thing->player)
	{ // [RH] Fake taller height to catch stepping up into things.
		thing->Height = realHeight + thing->MaxStepHeight;
	}

	tm.stepthing = NULL;
	FBoundingBox box(pos.X, pos.Y, thing->radius);

	FPortalGroupArray pcheck;
	FMultiBlockThingsIterator it2(pcheck, pos.X, pos.Y, thing->Z(), thing->Height, thing->radius, false, newsec);
	FMultiBlockThingsIterator::CheckResult tcres;

	while ((it2.Next(&tcres)))
	{
		if (!PIT_CheckThing(it2, tcres, it2.Box(), tm))
		{ // [RH] If a thing can be stepped up on, we need to continue checking
			// other things in the blocks and see if we hit something that is
			// definitely blocking. Otherwise, we need to check the lines, or we
			// could end up stuck inside a wall.
			AActor *BlockingMobj = thing->BlockingMobj;

			// If this blocks through a restricted line portal, it will always completely block.
			if (BlockingMobj == NULL || (i_compatflags & COMPATF_NO_PASSMOBJ) || (tcres.portalflags & FFCF_RESTRICTEDPORTAL))
			{ // Thing slammed into something; don't let it move now.
				thing->Height = realHeight;
				return false;
			}
			else if (!BlockingMobj->player && !(thing->flags & (MF_FLOAT | MF_MISSILE | MF_SKULLFLY)) &&
				BlockingMobj->Top() - thing->Z() <= thing->MaxStepHeight)
			{
				if (thingblocker == NULL ||
					BlockingMobj->Z() > thingblocker->Z())
				{
					thingblocker = BlockingMobj;
				}
				thing->BlockingMobj = NULL;
			}
			else if (thing->player &&
				thing->Top() - BlockingMobj->Z() <= thing->MaxStepHeight)
			{
				if (thingblocker)
				{ // There is something to step up on. Return this thing as
					// the blocker so that we don't step up.
					thing->Height = realHeight;
					return false;
				}
				// Nothing is blocking us, but this actor potentially could
				// if there is something else to step on.
				thing->BlockingMobj = NULL;
			}
			else
			{ // Definitely blocking
				thing->Height = realHeight;
				return false;
			}
		}
	}

	// check lines

	// [RH] We need to increment validcount again, because a function above may
	// have already set some lines to equal the current validcount.
	//
	// Specifically, when DehackedPickup spawns a new item in its TryPickup()
	// function, that new actor will set the lines around it to match validcount
	// when it links itself into the world. If we just leave validcount alone,
	// that will give the player the freedom to walk through walls at will near
	// a pickup they cannot get, because their validcount will prevent them from
	// being considered for collision with the player.
	validcount++;

	thing->BlockingMobj = NULL;
	thing->Height = realHeight;
	if (actorsonly || (thing->flags & MF_NOCLIP))
		return (thing->BlockingMobj = thingblocker) == NULL;

	spechit.Clear();
	portalhit.Clear();

	FMultiBlockLinesIterator it(pcheck, pos.X, pos.Y, thing->Z(), thing->Height, thing->radius, newsec);
	FMultiBlockLinesIterator::CheckResult lcres;

	double thingdropoffz = tm.floorz;
	//bool onthing = (thingdropoffz != tmdropoffz);
	tm.floorz = tm.dropoffz;

	bool good = true;

	while (it.Next(&lcres))
	{
		bool thisresult = PIT_CheckLine(it, lcres, it.Box(), tm);
		good &= thisresult;
		if (thisresult)
		{
			FLinePortal *port = lcres.line->getPortal();
			if (port != NULL && port->mFlags & PORTF_PASSABLE && port->mType != PORTT_LINKED)
			{
				// Checking the other side of the portal completely is too costly,
				// but checking the portal's destination line is necessary to 
				// retrieve the proper sector heights on the other side.
				if (PIT_CheckPortal(it, lcres, it.Box(), tm))
				{
					tm.thing->BlockingLine = lcres.line;
				}
			}
		}
	}
	if (!good)
	{
		return false;
	}
	if (tm.ceilingz - tm.floorz < thing->Height)
	{
		return false;
	}
	if (tm.touchmidtex)
	{
		tm.dropoffz = tm.floorz;
	}
	else if (tm.stepthing != NULL)
	{
		tm.dropoffz = thingdropoffz;
	}

	return (thing->BlockingMobj = thingblocker) == NULL;
}